

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O2

int __thiscall qclab::qgates::CX<float>::toQASM(CX<float> *this,ostream *stream,int offset)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int qubit;
  __string_type _Stack_48;
  
  if ((this->super_QControlledGate2<float>).controlState_ == 0) {
    qasmX_abi_cxx11_(&_Stack_48,
                     (qclab *)(ulong)(uint)((this->super_QControlledGate2<float>).control_ + offset)
                     ,offset);
    std::operator<<(stream,(string *)&_Stack_48);
    std::__cxx11::string::~string((string *)&_Stack_48);
  }
  iVar1 = (this->super_QControlledGate2<float>).control_;
  iVar2 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
            _vptr_QObject[0xf])(this);
  qasmCX_abi_cxx11_(&_Stack_48,(qclab *)(ulong)(uint)(iVar1 + offset),iVar2 + offset,in_ECX);
  std::operator<<(stream,(string *)&_Stack_48);
  std::__cxx11::string::~string((string *)&_Stack_48);
  if ((this->super_QControlledGate2<float>).controlState_ == 0) {
    qasmX_abi_cxx11_(&_Stack_48,
                     (qclab *)(ulong)(uint)(offset + (this->super_QControlledGate2<float>).control_)
                     ,qubit);
    std::operator<<(stream,(string *)&_Stack_48);
    std::__cxx11::string::~string((string *)&_Stack_48);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          stream << qasmCX( this->control() + offset ,
                            this->target()  + offset ) ;
          if ( this->controlState() == 0 ) {
            stream << qasmX( this->control() + offset ) ;
          }
          return 0 ;
        }